

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void blend_a64_mask_b12_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint16_t *puVar1;
  long lVar2;
  undefined1 in_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar4 [16];
  uint16_t uVar5;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  uint16_t uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar7 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  auVar3 = pmovsxbw(in_XMM0,0x4040404040404040);
  do {
    if (0 < w) {
      lVar2 = 0;
      do {
        auVar4 = pmovzxbw(in_XMM2,*(undefined8 *)(mask + lVar2));
        auVar8 = *(undefined1 (*) [16])(src0 + lVar2);
        puVar1 = src1 + lVar2;
        auVar22._0_12_ = auVar4._0_12_;
        auVar22._12_2_ = auVar4._6_2_;
        auVar22._14_2_ = auVar3._6_2_ - auVar4._6_2_;
        auVar21._12_4_ = auVar22._12_4_;
        auVar21._0_10_ = auVar4._0_10_;
        auVar21._10_2_ = auVar3._4_2_ - auVar4._4_2_;
        auVar20._10_6_ = auVar21._10_6_;
        auVar20._0_8_ = auVar4._0_8_;
        auVar20._8_2_ = auVar4._4_2_;
        auVar19._8_8_ = auVar20._8_8_;
        auVar19._6_2_ = auVar3._2_2_ - auVar4._2_2_;
        auVar19._4_2_ = auVar4._2_2_;
        auVar19._2_2_ = auVar3._0_2_ - auVar4._0_2_;
        auVar19._0_2_ = auVar4._0_2_;
        in_XMM2._2_2_ = auVar3._8_2_ - auVar4._8_2_;
        in_XMM2._0_2_ = auVar4._8_2_;
        in_XMM2._4_2_ = auVar4._10_2_;
        in_XMM2._6_2_ = auVar3._10_2_ - auVar4._10_2_;
        in_XMM2._8_2_ = auVar4._12_2_;
        in_XMM2._10_2_ = auVar3._12_2_ - auVar4._12_2_;
        in_XMM2._12_2_ = auVar4._14_2_;
        in_XMM2._14_2_ = auVar3._14_2_ - auVar4._14_2_;
        auVar7._0_12_ = auVar8._0_12_;
        auVar7._12_2_ = auVar8._6_2_;
        auVar7._14_2_ = puVar1[3];
        auVar6._12_4_ = auVar7._12_4_;
        auVar6._0_10_ = auVar8._0_10_;
        auVar6._10_2_ = puVar1[2];
        auVar17._10_6_ = auVar6._10_6_;
        auVar17._0_8_ = auVar8._0_8_;
        auVar17._8_2_ = auVar8._4_2_;
        auVar4._8_8_ = auVar17._8_8_;
        auVar4._6_2_ = puVar1[1];
        auVar4._4_2_ = auVar8._2_2_;
        auVar4._0_2_ = auVar8._0_2_;
        auVar4._2_2_ = *puVar1;
        auVar4 = pmaddwd(auVar4,auVar19);
        auVar16._2_2_ = puVar1[4];
        auVar16._0_2_ = auVar8._8_2_;
        auVar16._4_2_ = auVar8._10_2_;
        auVar16._6_2_ = puVar1[5];
        auVar16._8_2_ = auVar8._12_2_;
        auVar16._10_2_ = puVar1[6];
        auVar16._12_2_ = auVar8._14_2_;
        auVar16._14_2_ = puVar1[7];
        auVar17 = pmaddwd(auVar16,in_XMM2);
        auVar8._0_4_ = auVar4._0_4_ >> 5;
        auVar8._4_4_ = auVar4._4_4_ >> 5;
        auVar8._8_4_ = auVar4._8_4_ >> 5;
        auVar8._12_4_ = auVar4._12_4_ >> 5;
        auVar18._0_4_ = auVar17._0_4_ >> 5;
        auVar18._4_4_ = auVar17._4_4_ >> 5;
        auVar18._8_4_ = auVar17._8_4_ >> 5;
        auVar18._12_4_ = auVar17._12_4_ >> 5;
        auVar8 = packssdw(auVar8,auVar18);
        uVar5 = pavgw(auVar8._0_2_,0);
        uVar9 = pavgw(auVar8._2_2_,0);
        uVar10 = pavgw(auVar8._4_2_,0);
        uVar11 = pavgw(auVar8._6_2_,0);
        uVar12 = pavgw(auVar8._8_2_,0);
        uVar13 = pavgw(auVar8._10_2_,0);
        uVar14 = pavgw(auVar8._12_2_,0);
        uVar15 = pavgw(auVar8._14_2_,0);
        puVar1 = dst + lVar2;
        *puVar1 = uVar5;
        puVar1[1] = uVar9;
        puVar1[2] = uVar10;
        puVar1[3] = uVar11;
        puVar1[4] = uVar12;
        puVar1[5] = uVar13;
        puVar1[6] = uVar14;
        puVar1[7] = uVar15;
        lVar2 = lVar2 + 8;
      } while ((int)lVar2 < w);
    }
    mask = mask + mask_stride;
    dst = dst + dst_stride;
    src1 = src1 + src1_stride;
    src0 = src0 + src0_stride;
    h = h + -1;
  } while (h != 0);
  return;
}

Assistant:

static void blend_a64_mask_b12_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  blend_a64_mask_bn_w8n_sse4_1(dst, dst_stride, src0, src0_stride, src1,
                               src1_stride, mask, mask_stride, w, h,
                               blend_8_b12);
}